

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void output_trailing_text(void)

{
  char cVar1;
  FILE *__stream;
  file_info *__ptr;
  int __c;
  uint uVar2;
  int iVar3;
  FILE *__stream_00;
  
  __stream = code_file;
  if (line == (char *)0x0) {
    return;
  }
  __stream_00 = (FILE *)input_file->file;
  if (lflag == '\0') {
    outline = outline + 1;
    fprintf((FILE *)code_file,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  while( true ) {
    cVar1 = *cptr;
    if (cVar1 == '\n') break;
    cptr = cptr + 1;
    putc((int)cVar1,(FILE *)__stream);
  }
  outline = outline + 1;
  cptr = cptr + 1;
  putc(10,(FILE *)__stream);
LAB_00110adb:
  iVar3 = 10;
  do {
    __c = getc(__stream_00);
    __ptr = input_file;
    if (__c == 10) {
      outline = outline + 1;
    }
    else if (__c == -1) break;
    putc(__c,(FILE *)__stream);
    iVar3 = __c;
  } while( true );
  if (input_file->next == (file_info *)0x0) {
    if (iVar3 != 10) {
      outline = outline + 1;
      putc(10,(FILE *)__stream);
    }
    if (lflag != '\0') {
      return;
    }
    uVar2 = outline + 2;
    outline = outline + 1;
    fprintf((FILE *)__stream,line_format,(ulong)uVar2,code_file_name);
    return;
  }
  fclose((FILE *)input_file->file);
  free(input_file->name);
  input_file = input_file->next;
  free(__ptr);
  __stream_00 = (FILE *)input_file->file;
  if (iVar3 != 10) {
    outline = outline + 1;
    putc(10,(FILE *)__stream);
  }
  if (lflag == '\0') {
    outline = outline + 1;
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  goto LAB_00110adb;
}

Assistant:

void output_trailing_text()
{
    register int c, last;
    register FILE *in, *out;

    if (line == 0)
	return;

    in = input_file->file;
    out = code_file;
    if (!lflag)
    {
	++outline;
	fprintf(out, line_format, input_file->lineno, input_file->name);
    }
    while ((c = *cptr++) != '\n') {
	putc(c, out); }
    ++outline;
    putc('\n', out);
    last = '\n';

    while ((c = getc(in)) != EOF || input_file->next)
    {
	if (c == EOF) {
	    void *t = input_file;
	    fclose(input_file->file);
	    FREE(input_file->name);
	    input_file = input_file->next;
	    FREE(t);
	    in = input_file->file;
	    if (last != '\n')
	    {
		++outline;
		putc('\n', out);
		last = '\n';
	    }
	    if (!lflag) {
		++outline;
		fprintf(out, line_format, input_file->lineno, input_file->name);
	    }
	    continue; }
	if (c == '\n')
	    ++outline;
	putc(c, out);
	last = c;
    }

    if (last != '\n')
    {
	++outline;
	putc('\n', out);
    }
    if (!lflag)
	fprintf(out, line_format, ++outline + 1, code_file_name);
}